

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::getMessageTarget
          (RpcConnectionState *this,Reader *target)

{
  ushort uVar1;
  PipelineHook *pPVar2;
  Reader ops;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint *puVar6;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Export_&> MVar7;
  Answer *pAVar8;
  char (*params) [80];
  Reader *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar9;
  uint id;
  uint uVar10;
  undefined8 this_00;
  undefined8 uVar11;
  Maybe<kj::Own<capnp::ClientHook>_> MVar12;
  Own<capnp::PipelineHook> pipeline;
  Reader promisedAnswer;
  Fault f;
  NullableValue<kj::Array<capnp::PipelineOp>_> local_228;
  Own<capnp::PipelineHook> local_208;
  Array<char> local_1f0;
  Reader local_1d8;
  Reader local_1a8;
  Exception local_178;
  
  uVar10 = (in_RDX->_reader).dataSize;
  if (uVar10 < 0x30) {
    id = 0;
    if (0x1f < uVar10) {
      puVar6 = (uint *)(in_RDX->_reader).data;
LAB_003f9249:
      id = *puVar6;
    }
    MVar7 = ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>::
            find((ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
                  *)&target[9]._reader.capTable,id);
    if (MVar7.ptr != (Export *)0x0) {
      (*(((MVar7.ptr)->clientHook).ptr)->_vptr_ClientHook[4])(&local_178);
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)
           CONCAT71(local_178.ownFile.content.ptr._1_7_,(char)local_178.ownFile.content.ptr);
      (this->super_Refcounted).super_Disposer._vptr_Disposer =
           (_func_int **)local_178.ownFile.content.size_;
      local_178.ownFile.content.size_ = 0;
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_178);
      pCVar9 = extraout_RDX;
      goto LAB_003f94e3;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
              ((Fault *)&local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x986,FAILED,(char *)0x0,"\"Message target is not a current export ID.\"",
               (char (*) [43])"Message target is not a current export ID.");
  }
  else {
    puVar6 = (uint *)(in_RDX->_reader).data;
    uVar1 = (ushort)puVar6[1];
    params = (char (*) [80])(ulong)uVar1;
    if (uVar1 == 1) {
      rpc::MessageTarget::Reader::getPromisedAnswer(&local_1a8,in_RDX);
      local_208.disposer = (Disposer *)0x0;
      local_208.ptr = (PipelineHook *)0x0;
      uVar10 = 0;
      if (0x1f < local_1a8._reader.dataSize) {
        uVar10 = *local_1a8._reader.data;
      }
      this_00 = &target[0xb]._reader.nestingLimit;
      pAVar8 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
               ::operator[]((ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                             *)this_00,uVar10);
      if (pAVar8->active == false) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
                  ((Fault *)&local_178,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x992,FAILED,"base.active",
                   "\"PromisedAnswer.questionId is not a current question.\"",
                   (char (*) [53])"PromisedAnswer.questionId is not a current question.");
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&local_178);
      }
      else {
        pPVar2 = (pAVar8->pipeline).ptr.ptr;
        if (pPVar2 == (PipelineHook *)0x0) {
          kj::_::Debug::makeDescription<char_const(&)[80]>
                    ((String *)&local_1f0,
                     (Debug *)
                     "\"Pipeline call on a request that returned no capabilities or was already closed.\""
                     ,
                     "Pipeline call on a request that returned no capabilities or was already closed."
                     ,params);
          this_00 = &local_178;
          kj::Exception::Exception
                    ((Exception *)this_00,FAILED,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x999,(String *)&local_1f0);
          newBrokenPipeline((capnp *)&local_228,(Exception *)this_00);
          kj::Own<capnp::PipelineHook>::operator=(&local_208,(Own<capnp::PipelineHook> *)&local_228)
          ;
          kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&local_228);
          kj::Exception::~Exception(&local_178);
          kj::Array<char>::~Array(&local_1f0);
        }
        else {
          (**pPVar2->_vptr_PipelineHook)(&local_178);
          kj::Own<capnp::PipelineHook>::operator=(&local_208,(Own<capnp::PipelineHook> *)&local_178)
          ;
          kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&local_178);
        }
        rpc::PromisedAnswer::Reader::getTransform(&local_1d8,&local_1a8);
        ops.reader.capTable = local_1d8.reader.capTable;
        ops.reader.segment = local_1d8.reader.segment;
        ops.reader.ptr = local_1d8.reader.ptr;
        ops.reader.elementCount = local_1d8.reader.elementCount;
        ops.reader.step = local_1d8.reader.step;
        ops.reader.structDataSize = local_1d8.reader.structDataSize;
        ops.reader.structPointerCount = local_1d8.reader.structPointerCount;
        ops.reader.elementSize = local_1d8.reader.elementSize;
        ops.reader._39_1_ = local_1d8.reader._39_1_;
        ops.reader.nestingLimit = local_1d8.reader.nestingLimit;
        ops.reader._44_4_ = local_1d8.reader._44_4_;
        toPipelineOps(ops);
        uVar5 = local_228.field_1.value.size_;
        uVar4 = local_228.field_1.value.ptr;
        bVar3 = local_228.isSet;
        local_178.ownFile.content.ptr._0_1_ = local_228.isSet;
        uVar11 = (PipelineOp *)&local_1a8;
        if (local_228.isSet == true) {
          local_178.ownFile.content.size_ = (size_t)local_228.field_1.value.ptr;
          local_178.ownFile.content.disposer = (ArrayDisposer *)local_228.field_1.value.size_;
          local_178.file = (char *)local_228.field_1.value.disposer;
          local_228.field_1.value.ptr = (PipelineOp *)0x0;
          local_228.field_1.value.size_ = 0;
          this_00 = uVar5;
          uVar11 = uVar4;
        }
        kj::_::NullableValue<kj::Array<capnp::PipelineOp>_>::~NullableValue(&local_228);
        if (bVar3 == false) {
          (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
          (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        }
        else {
          (*(local_208.ptr)->_vptr_PipelineHook[1])(&local_228,local_208.ptr,uVar11,this_00);
          (this->super_ErrorHandler)._vptr_ErrorHandler =
               (_func_int **)CONCAT71(local_228._1_7_,local_228.isSet);
          (this->super_Refcounted).super_Disposer._vptr_Disposer =
               (_func_int **)local_228.field_1.value.ptr;
          local_228.field_1.value.ptr = (PipelineOp *)0x0;
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_228);
        }
        kj::_::NullableValue<kj::Array<capnp::PipelineOp>_>::~NullableValue
                  ((NullableValue<kj::Array<capnp::PipelineOp>_> *)&local_178);
      }
      kj::Own<capnp::PipelineHook>::dispose(&local_208);
      pCVar9 = extraout_RDX_01;
      goto LAB_003f94e3;
    }
    if (uVar1 == 0) goto LAB_003f9249;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader_const&>
              ((Fault *)&local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x9a5,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
               (char (*) [29])"Unknown message target type.",in_RDX);
  }
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  kj::_::Debug::Fault::~Fault((Fault *)&local_178);
  pCVar9 = extraout_RDX_00;
LAB_003f94e3:
  MVar12.ptr.ptr = pCVar9;
  MVar12.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar12.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> getMessageTarget(const rpc::MessageTarget::Reader& target) {
    switch (target.which()) {
      case rpc::MessageTarget::IMPORTED_CAP: {
        KJ_IF_MAYBE(exp, exports.find(target.getImportedCap())) {
          return exp->clientHook->addRef();
        } else {
          KJ_FAIL_REQUIRE("Message target is not a current export ID.") {
            return nullptr;
          }
        }
        break;
      }